

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maxminddb.c
# Opt level: O2

int MMDB_open(char *filename,uint32_t flags,MMDB_s *mmdb)

{
  uint uVar1;
  uint8_t *puVar2;
  long lVar3;
  uint8_t *puVar4;
  uint8_t *puVar5;
  _Bool _Var6;
  ushort uVar7;
  int iVar8;
  int iVar9;
  uint uVar10;
  size_t sVar11;
  char *pcVar12;
  int *piVar13;
  uint8_t *puVar14;
  uint8_t *puVar15;
  char **ppcVar16;
  MMDB_description_s **ppMVar17;
  MMDB_description_s *pMVar18;
  uint8_t *puVar19;
  uint16_t uVar20;
  uint8_t *puVar21;
  long lVar22;
  size_t sVar23;
  MMDB_entry_data_list_s *pMVar24;
  uint8_t *__s1;
  MMDB_entry_data_list_s *pMVar25;
  uint16_t *puVar26;
  ulong uVar27;
  bool bVar28;
  uint local_130;
  MMDB_entry_s local_120;
  MMDB_entry_data_list_s *local_110;
  MMDB_entry_data_s entry_data;
  MMDB_entry_s array_start;
  MMDB_s metadata_db;
  
  (mmdb->metadata).description.count = 0;
  mmdb->file_content = (uint8_t *)0x0;
  mmdb->data_section = (uint8_t *)0x0;
  (mmdb->metadata).database_type = (char *)0x0;
  (mmdb->metadata).languages.count = 0;
  (mmdb->metadata).languages.names = (char **)0x0;
  sVar11 = strlen(filename);
  pcVar12 = (char *)malloc(sVar11 + 1);
  if (pcVar12 == (char *)0x0) {
    mmdb->filename = (char *)0x0;
    piVar13 = __errno_location();
    local_130 = 5;
  }
  else {
    memcpy(pcVar12,filename,sVar11 + 1);
    mmdb->filename = pcVar12;
    mmdb->flags = (flags & 7) == 0 | flags;
    iVar8 = open(pcVar12,0x80000);
    local_130 = 1;
    if ((-1 < iVar8) && (iVar9 = fstat(iVar8,(stat *)&metadata_db), iVar9 == 0)) {
      if ((long)metadata_db.metadata_section < 0) {
        local_130 = 5;
      }
      else {
        local_130 = 0;
        puVar15 = (uint8_t *)mmap((void *)0x0,(size_t)metadata_db.metadata_section,1,1,iVar8,0);
        if (puVar15 == (uint8_t *)0xffffffffffffffff) {
          piVar13 = __errno_location();
          local_130 = *piVar13 == 0xc | 4;
        }
        else {
          mmdb->file_size = (ssize_t)metadata_db.metadata_section;
          mmdb->file_content = puVar15;
        }
      }
    }
    piVar13 = __errno_location();
    iVar9 = *piVar13;
    if (-1 < iVar8) {
      close(iVar8);
    }
    *piVar13 = iVar9;
    if (local_130 == 0) {
      puVar15 = (uint8_t *)mmdb->file_size;
      local_130 = 3;
      if (-1 < (long)puVar15) {
        puVar19 = (uint8_t *)0x20000;
        if (puVar15 < (uint8_t *)0x20000) {
          puVar19 = puVar15;
        }
        puVar2 = mmdb->file_content;
        puVar4 = puVar19;
        puVar5 = puVar2 + ((long)puVar15 - (long)puVar19);
        do {
          puVar21 = puVar5;
          puVar14 = puVar4;
          if ((uint8_t *)0xd < puVar14) {
            for (__s1 = puVar21; __s1 <= puVar21 + (long)(puVar14 + -0xe); __s1 = __s1 + 1) {
              if ((*__s1 == 0xab) && (iVar8 = bcmp(__s1,anon_var_dwarf_251e,0xe), iVar8 == 0))
              goto LAB_0010293a;
            }
          }
          __s1 = (uint8_t *)0x0;
LAB_0010293a:
          puVar4 = puVar21 + (long)(puVar14 + (-0xe - (long)__s1));
          puVar5 = __s1 + 0xe;
        } while (__s1 != (uint8_t *)0x0);
        if (puVar21 == (uint8_t *)0x0 || puVar21 == puVar2 + ((long)puVar15 - (long)puVar19)) {
          local_130 = 3;
        }
        else {
          mmdb->metadata_section = puVar21;
          mmdb->metadata_section_size = (uint32_t)puVar14;
          memset(&metadata_db,0,0x88);
          local_120.offset = 0;
          array_start.mmdb = (MMDB_s *)anon_var_dwarf_2535;
          array_start.offset = 0;
          array_start._12_4_ = 0;
          local_120.mmdb = &metadata_db;
          metadata_db.data_section = puVar21;
          metadata_db.data_section_size = (uint32_t)puVar14;
          local_130 = MMDB_aget_value(&local_120,&entry_data,(char **)&array_start);
          if (local_130 == 0) {
            if (entry_data.type == 6) {
              (mmdb->metadata).node_count = entry_data.field_1.pointer;
              uVar1 = 3;
              local_130 = uVar1;
              if (entry_data.field_1.pointer == 0) goto LAB_00102991;
              puVar26 = &(mmdb->metadata).record_size;
              local_130 = value_for_key_as_uint16(&local_120,"record_size",puVar26);
              if (local_130 != 0) goto LAB_00102991;
              uVar7 = *puVar26;
              uVar7 = uVar7 << 0xe | uVar7 >> 2;
              if (2 < uVar7 - 6) {
                local_130 = uVar1;
                if (uVar7 != 0) {
                  local_130 = 6;
                }
                goto LAB_00102991;
              }
              puVar26 = &(mmdb->metadata).ip_version;
              local_130 = value_for_key_as_uint16(&local_120,"ip_version",puVar26);
              if ((local_130 != 0) || (local_130 = uVar1, (*puVar26 | 2) != 6)) goto LAB_00102991;
              array_start.mmdb = (MMDB_s *)anon_var_dwarf_256e;
              array_start.offset = 0;
              array_start._12_4_ = 0;
              local_130 = MMDB_aget_value(&local_120,&entry_data,(char **)&array_start);
              if (local_130 != 0) goto LAB_00102991;
              if (entry_data.type == 2) {
                pcVar12 = mmdb_strndup((char *)CONCAT44(entry_data.field_1.uint64._4_4_,
                                                        entry_data.field_1.pointer),
                                       (ulong)entry_data.data_size);
                (mmdb->metadata).database_type = pcVar12;
                if (pcVar12 == (char *)0x0) {
                  local_130 = 5;
                }
                else {
                  local_130 = MMDB_aget_value(&local_120,&entry_data,
                                              &PTR_anon_var_dwarf_25b2_00109d90);
                  if (local_130 == 0) {
                    if (entry_data.type == 0xb) {
                      array_start.offset = entry_data.offset;
                      array_start.mmdb = &metadata_db;
                      local_130 = MMDB_get_entry_data_list(&array_start,&local_110);
                      pMVar24 = local_110;
                      if (local_130 != 0) goto LAB_00102991;
                      uVar27 = (ulong)(local_110->entry_data).data_size;
                      (mmdb->metadata).languages.count = 0;
                      ppcVar16 = (char **)calloc(uVar27,8);
                      (mmdb->metadata).languages.names = ppcVar16;
                      if (ppcVar16 == (char **)0x0) {
LAB_00102c7a:
                        MMDB_free_entry_data_list(pMVar24);
                        local_130 = 5;
                        goto LAB_00102991;
                      }
                      pMVar25 = pMVar24;
                      for (sVar23 = 1; sVar23 - uVar27 != 1; sVar23 = sVar23 + 1) {
                        pMVar25 = pMVar25->next;
                        if ((pMVar25->entry_data).type != 2) {
                          MMDB_free_entry_data_list(pMVar24);
                          goto LAB_00102cbf;
                        }
                        pcVar12 = mmdb_strndup((pMVar25->entry_data).field_1.utf8_string,
                                               (ulong)(pMVar25->entry_data).data_size);
                        (mmdb->metadata).languages.names[sVar23 - 1] = pcVar12;
                        if ((mmdb->metadata).languages.names[sVar23 - 1] == (char *)0x0)
                        goto LAB_00102c7a;
                        (mmdb->metadata).languages.count = sVar23;
                      }
                      MMDB_free_entry_data_list(pMVar24);
                      puVar26 = &(mmdb->metadata).binary_format_major_version;
                      local_130 = value_for_key_as_uint16
                                            (&local_120,"binary_format_major_version",puVar26);
                      if (local_130 != 0) goto LAB_00102991;
                      if (*puVar26 != 0) {
                        local_130 = value_for_key_as_uint16
                                              (&local_120,"binary_format_minor_version",
                                               &(mmdb->metadata).binary_format_minor_version);
                        if (local_130 != 0) goto LAB_00102991;
                        array_start.mmdb = (MMDB_s *)anon_var_dwarf_25a7;
                        array_start.offset = 0;
                        array_start._12_4_ = 0;
                        local_130 = MMDB_aget_value(&local_120,&entry_data,(char **)&array_start);
                        if (local_130 != 0) goto LAB_00102991;
                        if ((entry_data.type == 9) &&
                           ((mmdb->metadata).build_epoch =
                                 CONCAT44(entry_data.field_1.uint64._4_4_,entry_data.field_1.pointer
                                         ),
                           CONCAT44(entry_data.field_1.uint64._4_4_,entry_data.field_1.pointer) != 0
                           )) {
                          local_130 = MMDB_aget_value(&local_120,&entry_data,
                                                      &PTR_anon_var_dwarf_25c9_00109da0);
                          if (local_130 != 0) goto LAB_00102991;
                          if (entry_data.type == 7) {
                            array_start.offset = entry_data.offset;
                            array_start.mmdb = &metadata_db;
                            local_130 = MMDB_get_entry_data_list(&array_start,&local_110);
                            if (local_130 == 0) {
                              uVar27 = (ulong)(local_110->entry_data).data_size;
                              (mmdb->metadata).description.count = 0;
                              if (uVar27 == 0) {
                                (mmdb->metadata).description.descriptions =
                                     (MMDB_description_s **)0x0;
                                local_130 = 0;
                                bVar28 = true;
                              }
                              else {
                                ppMVar17 = (MMDB_description_s **)calloc(uVar27,8);
                                (mmdb->metadata).description.descriptions = ppMVar17;
                                local_130 = 5;
                                if (ppMVar17 == (MMDB_description_s **)0x0) {
                                  bVar28 = false;
                                }
                                else {
                                  sVar23 = 1;
                                  pMVar24 = local_110;
                                  do {
                                    bVar28 = sVar23 - uVar27 == 1;
                                    if (bVar28) {
                                      local_130 = 0;
                                      break;
                                    }
                                    pMVar18 = (MMDB_description_s *)calloc(1,0x10);
                                    ppMVar17[sVar23 - 1] = pMVar18;
                                    ppMVar17 = (mmdb->metadata).description.descriptions;
                                    pMVar18 = ppMVar17[sVar23 - 1];
                                    if (pMVar18 == (MMDB_description_s *)0x0) break;
                                    (mmdb->metadata).description.count = sVar23;
                                    pMVar18->language = (char *)0x0;
                                    ppMVar17[sVar23 - 1]->description = (char *)0x0;
                                    pMVar24 = pMVar24->next;
                                    if ((pMVar24->entry_data).type != 2) {
LAB_00102ec7:
                                      local_130 = 3;
                                      break;
                                    }
                                    pcVar12 = mmdb_strndup((pMVar24->entry_data).field_1.utf8_string
                                                           ,(ulong)(pMVar24->entry_data).data_size);
                                    ppMVar17 = (mmdb->metadata).description.descriptions;
                                    ppMVar17[sVar23 - 1]->language = pcVar12;
                                    if (ppMVar17[sVar23 - 1]->language == (char *)0x0) break;
                                    pMVar24 = pMVar24->next;
                                    if ((pMVar24->entry_data).type != 2) goto LAB_00102ec7;
                                    pcVar12 = mmdb_strndup((pMVar24->entry_data).field_1.utf8_string
                                                           ,(ulong)(pMVar24->entry_data).data_size);
                                    ppMVar17 = (mmdb->metadata).description.descriptions;
                                    ppMVar17[sVar23 - 1]->description = pcVar12;
                                    lVar3 = sVar23 - 1;
                                    sVar23 = sVar23 + 1;
                                  } while (ppMVar17[lVar3]->description != (char *)0x0);
                                }
                              }
                              MMDB_free_entry_data_list(local_110);
                              if (bVar28) {
                                uVar7 = (mmdb->metadata).record_size >> 2;
                                mmdb->full_record_byte_size = uVar7;
                                uVar20 = 0x80;
                                if ((mmdb->metadata).ip_version == 4) {
                                  uVar20 = 0x20;
                                }
                                mmdb->depth = uVar20;
                                if ((mmdb->metadata).binary_format_major_version == 2) {
                                  _Var6 = can_multiply(0x7fffffffffffffff,
                                                       (ulong)(mmdb->metadata).node_count,
                                                       (ulong)uVar7);
                                  local_130 = 3;
                                  if (!_Var6) goto LAB_00102991;
                                  uVar1 = (mmdb->metadata).node_count;
                                  lVar22 = (ulong)mmdb->full_record_byte_size * (ulong)uVar1;
                                  lVar3 = mmdb->file_size;
                                  puVar15 = mmdb->file_content;
                                  mmdb->data_section = puVar15 + lVar22 + 0x10;
                                  if ((lVar22 - (lVar3 + -0x10) != 0 && lVar3 + -0x10 <= lVar22 ||
                                       lVar3 < 0x10) ||
                                     ((lVar3 - lVar22) - 0x100000010U < 0xffffffff00000001))
                                  goto LAB_00102991;
                                  uVar10 = (int)(lVar3 - lVar22) - 0x10;
                                  mmdb->data_section_size = uVar10;
                                  if (uVar10 < 3) {
                                    local_130 = 7;
                                    goto LAB_00102991;
                                  }
                                  mmdb->metadata_section = puVar21;
                                  (mmdb->ipv4_start_node).node_value = 0;
                                  (mmdb->ipv4_start_node).netmask = 0;
                                  if ((mmdb->metadata).ip_version != 6) {
                                    return 0;
                                  }
                                  record_info_for_database((record_info_s *)&metadata_db,mmdb);
                                  if ((char)metadata_db.file_content != '\0') {
                                    uVar10 = 0;
                                    local_130 = 2;
                                    uVar7 = 0;
                                    while( true ) {
                                      if ((0x5f < uVar7) || (uVar1 <= uVar10)) {
                                        (mmdb->ipv4_start_node).node_value = uVar10;
                                        (mmdb->ipv4_start_node).netmask = uVar7;
                                        return 0;
                                      }
                                      puVar19 = puVar15 + uVar10 * (ushort)metadata_db.flags;
                                      if (mmdb->data_section < puVar19 + (ushort)metadata_db.flags)
                                      break;
                                      uVar10 = (*(code *)metadata_db.filename)(puVar19);
                                      uVar7 = uVar7 + 1;
                                    }
                                    goto LAB_00102991;
                                  }
                                }
                                local_130 = 6;
                              }
                            }
                            goto LAB_00102991;
                          }
                        }
                      }
                    }
LAB_00102cbf:
                    local_130 = 3;
                  }
                }
                goto LAB_00102991;
              }
            }
            local_130 = 3;
          }
        }
      }
    }
  }
LAB_00102991:
  iVar8 = *piVar13;
  free_mmdb_struct(mmdb);
  *piVar13 = iVar8;
  return local_130;
}

Assistant:

int MMDB_open(const char *const filename, uint32_t flags, MMDB_s *const mmdb) {
    int status = MMDB_SUCCESS;

    mmdb->file_content = NULL;
    mmdb->data_section = NULL;
    mmdb->metadata.database_type = NULL;
    mmdb->metadata.languages.count = 0;
    mmdb->metadata.languages.names = NULL;
    mmdb->metadata.description.count = 0;

    mmdb->filename = mmdb_strdup(filename);
    if (NULL == mmdb->filename) {
        status = MMDB_OUT_OF_MEMORY_ERROR;
        goto cleanup;
    }

    if ((flags & MMDB_MODE_MASK) == 0) {
        flags |= MMDB_MODE_MMAP;
    }
    mmdb->flags = flags;

    if (MMDB_SUCCESS != (status = map_file(mmdb))) {
        goto cleanup;
    }

#ifdef _WIN32
    WSADATA wsa;
    WSAStartup(MAKEWORD(2, 2), &wsa);
#endif

    uint32_t metadata_size = 0;
    const uint8_t *metadata =
        find_metadata(mmdb->file_content, mmdb->file_size, &metadata_size);
    if (NULL == metadata) {
        status = MMDB_INVALID_METADATA_ERROR;
        goto cleanup;
    }

    mmdb->metadata_section = metadata;
    mmdb->metadata_section_size = metadata_size;

    status = read_metadata(mmdb);
    if (MMDB_SUCCESS != status) {
        goto cleanup;
    }

    if (mmdb->metadata.binary_format_major_version != 2) {
        status = MMDB_UNKNOWN_DATABASE_FORMAT_ERROR;
        goto cleanup;
    }

    if (!can_multiply(SSIZE_MAX,
                      mmdb->metadata.node_count,
                      mmdb->full_record_byte_size)) {
        status = MMDB_INVALID_METADATA_ERROR;
        goto cleanup;
    }
    ssize_t search_tree_size = (ssize_t)mmdb->metadata.node_count *
                               (ssize_t)mmdb->full_record_byte_size;

    mmdb->data_section =
        mmdb->file_content + search_tree_size + MMDB_DATA_SECTION_SEPARATOR;
    if (mmdb->file_size < MMDB_DATA_SECTION_SEPARATOR ||
        search_tree_size > mmdb->file_size - MMDB_DATA_SECTION_SEPARATOR) {
        status = MMDB_INVALID_METADATA_ERROR;
        goto cleanup;
    }
    ssize_t data_section_size =
        mmdb->file_size - search_tree_size - MMDB_DATA_SECTION_SEPARATOR;
    if (data_section_size > UINT32_MAX || data_section_size <= 0) {
        status = MMDB_INVALID_METADATA_ERROR;
        goto cleanup;
    }
    mmdb->data_section_size = (uint32_t)data_section_size;

    // Although it is likely not possible to construct a database with valid
    // valid metadata, as parsed above, and a data_section_size less than 3,
    // we do this check as later we assume it is at least three when doing
    // bound checks.
    if (mmdb->data_section_size < 3) {
        status = MMDB_INVALID_DATA_ERROR;
        goto cleanup;
    }

    mmdb->metadata_section = metadata;
    mmdb->ipv4_start_node.node_value = 0;
    mmdb->ipv4_start_node.netmask = 0;

    // We do this immediately as otherwise there is a race to set
    // ipv4_start_node.node_value and ipv4_start_node.netmask.
    if (mmdb->metadata.ip_version == 6) {
        status = find_ipv4_start_node(mmdb);
        if (status != MMDB_SUCCESS) {
            goto cleanup;
        }
    }

cleanup:
    if (MMDB_SUCCESS != status) {
        int saved_errno = errno;
        free_mmdb_struct(mmdb);
        errno = saved_errno;
    }
    return status;
}